

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O3

void __thiscall QueryResult::do_or(QueryResult *this,QueryResult *other,QueryCounter *counter)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  QueryOperation op;
  QueryOperation local_20;
  
  local_20.parent = counter;
  local_20.start_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if ((this->has_everything == false) && (other->has_everything != true)) {
    SortedRun::do_or(&this->results,&other->results);
  }
  else {
    this->has_everything = true;
    puVar1 = (this->results).sequence_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->results).sequence_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->results).sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->results).sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->results).sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    }
    puVar3 = (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3,(long)puVar4 - (long)puVar3);
    }
  }
  QueryOperation::~QueryOperation(&local_20);
  return;
}

Assistant:

void QueryResult::do_or(QueryResult &&other, QueryCounter *counter) {
    auto op = QueryOperation(counter);
    if (this->is_everything() || other.is_everything()) {
        has_everything = true;
        results = std::move(SortedRun());
    } else {
        results.do_or(other.results);
    }
}